

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void to_top_objects_undo_proc(Am_Object *command_obj)

{
  Am_Value local_28;
  Am_Object local_18;
  Am_Object *local_10;
  Am_Object *command_obj_local;
  
  local_10 = command_obj;
  Am_Object::Am_Object(&local_18,command_obj);
  Am_Value::Am_Value(&local_28,&Am_No_Value);
  to_top_or_bottom_general_undo_redo(&local_18,true,false,false,true,&local_28);
  Am_Value::~Am_Value(&local_28);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, to_top_objects_undo,
                 (Am_Object command_obj))
{
  to_top_or_bottom_general_undo_redo(command_obj, true, false, false, true);
}